

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

_Bool ppc_cpu_tlb_fill_ppc
                (CPUState_conflict *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  int local_4c;
  int ret;
  CPUPPCState_conflict *env;
  PowerPCCPUClass *pcc;
  PowerPCCPU_conflict *cpu;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr addr_local;
  CPUState_conflict *cs_local;
  
  if (cs[3].tb_jmp_cache[0x713] == (TranslationBlock_conflict *)0x0) {
    local_4c = cpu_ppc_handle_mmu_fault
                         ((CPUPPCState_conflict *)(cs[1].tb_jmp_cache + 0x34f),
                          (target_ulong_conflict)addr,access_type,mmu_idx);
  }
  else {
    local_4c = (*(code *)cs[3].tb_jmp_cache[0x713])(cs,addr,access_type,mmu_idx,mmu_idx,retaddr);
  }
  if (local_4c == 0) {
    cs_local._7_1_ = true;
  }
  else {
    if (!probe) {
      raise_exception_err_ra_ppc
                ((CPUPPCState_conflict *)(cs[1].tb_jmp_cache + 0x34f),cs->exception_index,
                 *(uint32_t *)(cs[3].tb_jmp_cache + 0x5c5),retaddr);
    }
    cs_local._7_1_ = false;
  }
  return cs_local._7_1_;
}

Assistant:

bool ppc_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cs);
    CPUPPCState *env = &cpu->env;
    int ret;

    if (pcc->handle_mmu_fault) {
        ret = pcc->handle_mmu_fault(cpu, addr, access_type, mmu_idx);
    } else {
        ret = cpu_ppc_handle_mmu_fault(env, addr, access_type, mmu_idx);
    }
    if (unlikely(ret != 0)) {
        if (probe) {
            return false;
        }
        raise_exception_err_ra(env, cs->exception_index, env->error_code,
                               retaddr);
    }
    return true;
}